

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O1

FT_Fixed cff_parse_real(FT_Byte *start,FT_Byte *limit,FT_Long power_ten,FT_Long *scaling)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong a_;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  FT_Long FVar12;
  long lVar13;
  long lVar14;
  
  if (scaling != (FT_Long *)0x0) {
    *scaling = 0;
  }
  iVar5 = 4;
  bVar3 = false;
  lVar13 = 0;
  lVar11 = 0;
  uVar6 = 0;
  while( true ) {
    while( true ) {
      a_ = uVar6;
      if ((iVar5 != 0) && (start = start + 1, lVar4 = 0, limit <= start)) goto LAB_001421e9;
      bVar1 = *start >> ((byte)iVar5 & 0x1f);
      uVar8 = bVar1 & 0xf;
      iVar5 = 4 - iVar5;
      uVar6 = a_;
      if (uVar8 != 0xe) break;
      bVar3 = true;
    }
    if (9 < uVar8) break;
    if ((long)a_ < 0xccccccc) {
      if (((bVar1 & 0xf) != 0) || (uVar6 = 0, a_ != 0)) {
        lVar11 = lVar11 + 1;
        uVar6 = (ulong)uVar8 + a_ * 10;
      }
    }
    else {
      lVar13 = lVar13 + 1;
    }
  }
  if (uVar8 == 10) {
    lVar9 = 0;
LAB_00141fb1:
    do {
      do {
        if ((iVar5 != 0) && (start = start + 1, lVar4 = 0, limit <= start)) goto LAB_001421e9;
        bVar1 = *start >> ((byte)iVar5 & 0x1f);
        uVar8 = bVar1 & 0xf;
        iVar5 = 4 - iVar5;
        if (9 < uVar8) goto LAB_00142024;
        if (((bVar1 & 0xf) == 0) && (a_ == 0)) {
          lVar13 = lVar13 + -1;
          a_ = 0;
          goto LAB_00141fb1;
        }
      } while (8 < lVar9 || 0xccccccb < (long)a_);
      lVar9 = lVar9 + 1;
      a_ = (ulong)uVar8 + a_ * 10;
    } while( true );
  }
  lVar9 = 0;
LAB_00142024:
  lVar14 = 0;
  if (uVar8 - 0xb < 2) {
    bVar2 = false;
    lVar4 = 0;
    while( true ) {
      lVar7 = lVar4;
      if ((iVar5 != 0) && (start = start + 1, lVar4 = 0, limit <= start)) goto LAB_001421e9;
      uVar10 = *start >> ((byte)iVar5 & 0x1f) & 0xf;
      if (9 < uVar10) break;
      iVar5 = 4 - iVar5;
      lVar4 = (ulong)uVar10 + lVar7 * 10;
      if (1000 < lVar7) {
        bVar2 = true;
        lVar4 = lVar7;
      }
    }
    lVar14 = -lVar7;
    if (uVar8 != 0xc) {
      lVar14 = lVar7;
    }
    bVar2 = !bVar2;
  }
  else {
    bVar2 = true;
  }
  if (a_ != 0) {
    if (bVar2) {
      lVar14 = lVar13 + power_ten + lVar14;
      if (scaling != (FT_Long *)0x0) {
        lVar13 = lVar9 + lVar11;
        lVar11 = lVar11 + lVar14;
        if (5 < lVar13) {
          if ((long)a_ / *(FT_Long *)(cff_standard_encoding + lVar13 * 4 + 0xec) < 0x8000) {
            lVar4 = FT_DivFix(a_,*(FT_Long *)(cff_standard_encoding + lVar13 * 4 + 0xec));
            FVar12 = lVar11 + -5;
          }
          else {
            lVar4 = FT_DivFix(a_,*(FT_Long *)(cff_standard_encoding + lVar13 * 4 + 0xf0));
            FVar12 = lVar11 + -4;
          }
          *scaling = FVar12;
          goto LAB_001421e9;
        }
        if (0x7fff < (long)a_) {
          lVar4 = FT_DivFix(a_,10);
          *scaling = (lVar14 - lVar9) + 1;
          goto LAB_001421e9;
        }
        if (lVar11 < 1) {
LAB_001421d9:
          FVar12 = lVar14 - lVar9;
        }
        else {
          lVar4 = 5;
          if (lVar11 < 5) {
            lVar4 = lVar11;
          }
          if (lVar4 - lVar13 == 0 || lVar4 < lVar13) goto LAB_001421d9;
          FVar12 = lVar11 - lVar4;
          a_ = a_ * power_tens[lVar4 - lVar13];
          if (0x7fff < (long)a_) {
            a_ = a_ / 10;
            FVar12 = FVar12 + 1;
          }
        }
        *scaling = FVar12;
        lVar4 = a_ << 0x10;
        goto LAB_001421e9;
      }
      lVar13 = lVar14 + lVar11;
      lVar4 = 0x7fffffff;
      if (5 < lVar13) goto LAB_001421e9;
      if (-6 < lVar13) {
        if (lVar13 < 0) {
          a_ = (long)a_ / power_tens[-lVar13];
        }
        else {
          lVar11 = -lVar14;
        }
        lVar9 = lVar9 + lVar11;
        uVar6 = (long)a_ / 10;
        if (lVar9 != 10) {
          uVar6 = a_;
        }
        lVar11 = 9;
        if (lVar9 != 10) {
          lVar11 = lVar9;
        }
        if (lVar11 < 1) {
          lVar4 = 0x7fffffff;
          if ((long)(uVar6 * power_tens[-lVar11]) < 0x8000) {
            lVar4 = uVar6 * power_tens[-lVar11] * 0x10000;
          }
          goto LAB_001421e9;
        }
        if ((long)uVar6 / power_tens[lVar11] < 0x8000) {
          lVar4 = FT_DivFix(uVar6,power_tens[lVar11]);
          goto LAB_001421e9;
        }
      }
    }
    else {
      lVar4 = 0x7fffffff;
      if (uVar8 != 0xc) goto LAB_001421e9;
    }
  }
  lVar4 = 0;
LAB_001421e9:
  lVar11 = -lVar4;
  if (!bVar3) {
    lVar11 = lVar4;
  }
  return lVar11;
}

Assistant:

static FT_Fixed
  cff_parse_real( FT_Byte*  start,
                  FT_Byte*  limit,
                  FT_Long   power_ten,
                  FT_Long*  scaling )
  {
    FT_Byte*  p = start;
    FT_Int    nib;
    FT_UInt   phase;

    FT_Long   result, number, exponent;
    FT_Int    sign = 0, exponent_sign = 0, have_overflow = 0;
    FT_Long   exponent_add, integer_length, fraction_length;


    if ( scaling )
      *scaling = 0;

    result = 0;

    number   = 0;
    exponent = 0;

    exponent_add    = 0;
    integer_length  = 0;
    fraction_length = 0;

    /* First of all, read the integer part. */
    phase = 4;

    for (;;)
    {
      /* If we entered this iteration with phase == 4, we need to */
      /* read a new byte.  This also skips past the initial 0x1E. */
      if ( phase )
      {
        p++;

        /* Make sure we don't read past the end. */
        if ( p >= limit )
          goto Bad;
      }

      /* Get the nibble. */
      nib   = (FT_Int)( p[0] >> phase ) & 0xF;
      phase = 4 - phase;

      if ( nib == 0xE )
        sign = 1;
      else if ( nib > 9 )
        break;
      else
      {
        /* Increase exponent if we can't add the digit. */
        if ( number >= 0xCCCCCCCL )
          exponent_add++;
        /* Skip leading zeros. */
        else if ( nib || number )
        {
          integer_length++;
          number = number * 10 + nib;
        }
      }
    }

    /* Read fraction part, if any. */
    if ( nib == 0xA )
      for (;;)
      {
        /* If we entered this iteration with phase == 4, we need */
        /* to read a new byte.                                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Skip leading zeros if possible. */
        if ( !nib && !number )
          exponent_add--;
        /* Only add digit if we don't overflow. */
        else if ( number < 0xCCCCCCCL && fraction_length < 9 )
        {
          fraction_length++;
          number = number * 10 + nib;
        }
      }

    /* Read exponent, if any. */
    if ( nib == 12 )
    {
      exponent_sign = 1;
      nib           = 11;
    }

    if ( nib == 11 )
    {
      for (;;)
      {
        /* If we entered this iteration with phase == 4, */
        /* we need to read a new byte.                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Arbitrarily limit exponent. */
        if ( exponent > 1000 )
          have_overflow = 1;
        else
          exponent = exponent * 10 + nib;
      }

      if ( exponent_sign )
        exponent = -exponent;
    }

    if ( !number )
      goto Exit;

    if ( have_overflow )
    {
      if ( exponent_sign )
        goto Underflow;
      else
        goto Overflow;
    }

    /* We don't check `power_ten' and `exponent_add'. */
    exponent += power_ten + exponent_add;

    if ( scaling )
    {
      /* Only use `fraction_length'. */
      fraction_length += integer_length;
      exponent        += integer_length;

      if ( fraction_length <= 5 )
      {
        if ( number > 0x7FFFL )
        {
          result   = FT_DivFix( number, 10 );
          *scaling = exponent - fraction_length + 1;
        }
        else
        {
          if ( exponent > 0 )
          {
            FT_Long  new_fraction_length, shift;


            /* Make `scaling' as small as possible. */
            new_fraction_length = FT_MIN( exponent, 5 );
            shift               = new_fraction_length - fraction_length;

            if ( shift > 0 )
            {
              exponent -= new_fraction_length;
              number   *= power_tens[shift];
              if ( number > 0x7FFFL )
              {
                number   /= 10;
                exponent += 1;
              }
            }
            else
              exponent -= fraction_length;
          }
          else
            exponent -= fraction_length;

          result   = (FT_Long)( (FT_ULong)number << 16 );
          *scaling = exponent;
        }
      }
      else
      {
        if ( ( number / power_tens[fraction_length - 5] ) > 0x7FFFL )
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 4] );
          *scaling = exponent - 4;
        }
        else
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 5] );
          *scaling = exponent - 5;
        }
      }
    }
    else
    {
      integer_length  += exponent;
      fraction_length -= exponent;

      if ( integer_length > 5 )
        goto Overflow;
      if ( integer_length < -5 )
        goto Underflow;

      /* Remove non-significant digits. */
      if ( integer_length < 0 )
      {
        number          /= power_tens[-integer_length];
        fraction_length += integer_length;
      }

      /* this can only happen if exponent was non-zero */
      if ( fraction_length == 10 )
      {
        number          /= 10;
        fraction_length -= 1;
      }

      /* Convert into 16.16 format. */
      if ( fraction_length > 0 )
      {
        if ( ( number / power_tens[fraction_length] ) > 0x7FFFL )
          goto Exit;

        result = FT_DivFix( number, power_tens[fraction_length] );
      }
      else
      {
        number *= power_tens[-fraction_length];

        if ( number > 0x7FFFL )
          goto Overflow;

        result = (FT_Long)( (FT_ULong)number << 16 );
      }
    }

  Exit:
    if ( sign )
      result = -result;

    return result;

  Overflow:
    result = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    result = 0;
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    goto Exit;

  Bad:
    result = 0;
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    goto Exit;
  }